

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS
ref_cavity_form_edge_split
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT new_node)

{
  int iVar1;
  REF_NODE ref_node;
  REF_INT *pRVar2;
  REF_INT *pRVar3;
  REF_ADJ_ITEM pRVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  REF_INT RVar8;
  REF_STATUS RVar9;
  undefined8 uVar10;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  char *pcVar16;
  REF_INT RVar17;
  long lVar18;
  REF_CELL pRVar19;
  REF_INT seg_nodes [3];
  REF_BOOL all_local;
  REF_INT face_nodes [3];
  REF_BOOL already_have_it;
  REF_BOOL has_triangle;
  REF_INT local_94;
  int local_80;
  int local_7c;
  REF_INT local_78;
  int local_74;
  ulong local_70;
  REF_CELL local_68;
  long local_60;
  int local_58;
  int local_54 [4];
  int local_44;
  long local_40;
  ulong local_38;
  
  ref_node = ref_grid->node;
  ref_cavity->ref_grid = ref_grid;
  ref_cavity->node = new_node;
  pRVar2 = ref_node->part;
  iVar13 = ref_node->ref_mpi->id;
  local_40 = (long)node0;
  if (((iVar13 == pRVar2[local_40]) && (iVar13 == pRVar2[node1])) && (iVar13 == pRVar2[new_node])) {
    if ((0 < ref_grid->cell[9]->n) || (0 < ref_grid->cell[10]->n)) {
      ref_cavity->state = REF_CAVITY_MANIFOLD_CONSTRAINED;
      return 0;
    }
    ref_cavity->split_node0 = node0;
    ref_cavity->split_node1 = node1;
    pRVar19 = ref_grid->cell[8];
    uVar14 = 0xffffffff;
    if (-1 < node0) {
      uVar14 = 0xffffffff;
      if (node0 < pRVar19->ref_adj->nnode) {
        uVar14 = (ulong)(uint)pRVar19->ref_adj->first[local_40];
      }
    }
    local_58 = new_node;
    if ((int)uVar14 != -1) {
      RVar17 = pRVar19->ref_adj->item[(int)uVar14].ref;
      do {
        local_70 = uVar14;
        if (0 < pRVar19->node_per) {
          iVar13 = 0;
          local_60 = (long)RVar17;
          local_68 = (REF_CELL)CONCAT44(local_68._4_4_,RVar17);
          do {
            if (pRVar19->c2n[pRVar19->size_per * RVar17 + iVar13] == node1) {
              uVar7 = ref_list_contains(ref_cavity->tet_list,RVar17,local_54 + 3);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x589,"ref_cavity_form_edge_split",(ulong)uVar7,"have tet?");
                return uVar7;
              }
              if (local_54[3] != 0) {
                pcVar16 = "added tet twice?";
                uVar10 = 0x58a;
                goto LAB_001ace7a;
              }
              uVar7 = ref_list_push(ref_cavity->tet_list,RVar17);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x58b,"ref_cavity_form_edge_split",(ulong)uVar7,"save tet");
                return uVar7;
              }
              uVar7 = ref_cell_all_local(pRVar19,ref_node,RVar17,&local_74);
              if (uVar7 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x58c,"ref_cavity_form_edge_split",(ulong)uVar7,"local cell");
                return uVar7;
              }
              if (local_74 == 0) {
                ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
                return 0;
              }
              if (0 < pRVar19->face_per) {
                lVar18 = 0;
                lVar11 = 0;
                do {
                  pRVar2 = pRVar19->c2n;
                  iVar12 = pRVar19->size_per;
                  pRVar3 = pRVar19->f2n;
                  lVar15 = 0;
                  do {
                    local_54[lVar15] =
                         pRVar2[(long)*(int *)((long)pRVar3 + lVar15 * 4 + lVar18) +
                                iVar12 * local_60];
                    lVar15 = lVar15 + 1;
                  } while (lVar15 != 3);
                  if (((local_54[1] != node0 && local_54[0] != node0) && local_54[2] != node0 ||
                       (local_54[1] != node1 && local_54[0] != node1) && local_54[2] != node1) &&
                     (uVar7 = ref_cavity_insert_face(ref_cavity,local_54), uVar7 != 0)) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x59b,"ref_cavity_form_edge_split",(ulong)uVar7,"tet side");
                    return uVar7;
                  }
                  lVar11 = lVar11 + 1;
                  lVar18 = lVar18 + 0x10;
                } while (lVar11 < pRVar19->face_per);
              }
            }
            iVar13 = iVar13 + 1;
            RVar17 = (REF_INT)local_68;
          } while (iVar13 < pRVar19->node_per);
        }
        pRVar4 = pRVar19->ref_adj->item;
        iVar13 = pRVar4[(int)local_70].next;
        uVar14 = (ulong)iVar13;
        if (uVar14 == 0xffffffffffffffff) {
          RVar17 = -1;
        }
        else {
          RVar17 = pRVar4[uVar14].ref;
        }
      } while (iVar13 != -1);
    }
    pRVar19 = ref_grid->cell[3];
    uVar7 = ref_cell_has_side(pRVar19,node0,node1,&local_44);
    if (uVar7 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x5a2,"ref_cavity_form_edge_split",(ulong)uVar7,"triangle side");
      return uVar7;
    }
    if (local_44 != 0) {
      uVar14 = 0xffffffff;
      if (-1 < node0) {
        uVar14 = 0xffffffff;
        if (node0 < pRVar19->ref_adj->nnode) {
          uVar14 = (ulong)(uint)pRVar19->ref_adj->first[local_40];
        }
      }
      local_68 = pRVar19;
      if ((int)uVar14 != -1) {
        RVar17 = pRVar19->ref_adj->item[(int)uVar14].ref;
        RVar8 = node1;
        if (node0 < node1) {
          RVar8 = node0;
        }
        local_60 = CONCAT44(local_60._4_4_,RVar8);
        RVar8 = node1;
        if (node1 < node0) {
          RVar8 = node0;
        }
        do {
          local_38 = uVar14;
          if (0 < pRVar19->node_per) {
            iVar12 = 0;
            local_70 = CONCAT44(local_70._4_4_,RVar17);
            iVar13 = RVar17;
            do {
              if (pRVar19->c2n[pRVar19->size_per * iVar13 + iVar12] == node1) {
                uVar7 = ref_list_push(ref_cavity->tri_list,iVar13);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x5a5,"ref_cavity_form_edge_split",(ulong)uVar7,"save tri");
                  return uVar7;
                }
                uVar7 = ref_cell_all_local(pRVar19,ref_node,(int)local_70,&local_74);
                if (uVar7 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x5a7,"ref_cavity_form_edge_split",(ulong)uVar7,"local cell");
                  return uVar7;
                }
                if (local_74 == 0) goto LAB_001acd82;
                if (0 < pRVar19->edge_per) {
                  lVar11 = 0;
                  do {
                    pRVar2 = pRVar19->c2n;
                    lVar18 = (long)pRVar19->size_per * (long)RVar17;
                    lVar15 = (long)(int)lVar18;
                    iVar13 = pRVar2[pRVar19->e2n[lVar11 * 2] + lVar15];
                    iVar1 = pRVar2[pRVar19->e2n[lVar11 * 2 + 1] + lVar15];
                    iVar5 = iVar1;
                    if (iVar13 < iVar1) {
                      iVar5 = iVar13;
                    }
                    iVar6 = iVar1;
                    if (iVar1 < iVar13) {
                      iVar6 = iVar13;
                    }
                    if (((int)local_60 != iVar5) || (RVar8 != iVar6)) {
                      local_78 = pRVar2[lVar18 + 3];
                      local_80 = iVar13;
                      local_7c = iVar1;
                      uVar7 = ref_cavity_insert_seg(ref_cavity,&local_80);
                      pRVar19 = local_68;
                      if (uVar7 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0x5b6,"ref_cavity_form_edge_split",(ulong)uVar7,"tri side");
                        return uVar7;
                      }
                    }
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < pRVar19->edge_per);
                }
              }
              iVar12 = iVar12 + 1;
              iVar13 = (int)local_70;
            } while (iVar12 < pRVar19->node_per);
          }
          pRVar4 = pRVar19->ref_adj->item;
          iVar13 = pRVar4[(int)local_38].next;
          uVar14 = (ulong)iVar13;
          if (uVar14 == 0xffffffffffffffff) {
            RVar17 = -1;
          }
          else {
            RVar17 = pRVar4[uVar14].ref;
          }
        } while (iVar13 != -1);
      }
      iVar13 = ref_cavity->tri_list->n;
      if (1 < iVar13 - 1U) {
        pcVar16 = "expect one or two tri";
        uVar10 = 0x5bc;
LAB_001ace7a:
        printf("%s: %d: %s: %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
               uVar10,"ref_cavity_form_edge_split",pcVar16);
        return 1;
      }
      if (iVar13 == 1) {
        uVar14 = 0xffffffff;
        if (-1 < node0) {
          uVar14 = 0xffffffff;
          if (node0 < pRVar19->ref_adj->nnode) {
            uVar14 = (ulong)(uint)pRVar19->ref_adj->first[local_40];
          }
        }
        if ((int)uVar14 != -1) {
          local_94 = pRVar19->ref_adj->item[(int)uVar14].ref;
          RVar17 = node1;
          if (node0 < node1) {
            RVar17 = node0;
          }
          local_60 = CONCAT44(local_60._4_4_,RVar17);
          if (node0 <= node1) {
            node0 = node1;
          }
          do {
            local_70 = uVar14;
            if (0 < pRVar19->node_per) {
              iVar13 = 0;
              do {
                if ((pRVar19->c2n[pRVar19->size_per * local_94 + iVar13] == node1) &&
                   (0 < pRVar19->edge_per)) {
                  lVar11 = 0;
                  do {
                    pRVar2 = pRVar19->c2n;
                    lVar18 = (long)pRVar19->size_per * (long)local_94;
                    lVar15 = (long)(int)lVar18;
                    iVar12 = pRVar2[pRVar19->e2n[lVar11 * 2] + lVar15];
                    iVar1 = pRVar2[pRVar19->e2n[lVar11 * 2 + 1] + lVar15];
                    iVar5 = iVar1;
                    if (iVar12 < iVar1) {
                      iVar5 = iVar12;
                    }
                    iVar6 = iVar1;
                    if (iVar1 < iVar12) {
                      iVar6 = iVar12;
                    }
                    if (((int)local_60 == iVar5) && (node0 == iVar6)) {
                      local_7c = local_58;
                      local_78 = pRVar2[lVar18 + 3];
                      local_80 = iVar12;
                      uVar7 = ref_cavity_insert_seg(ref_cavity,&local_80);
                      if (uVar7 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0x5c9,"ref_cavity_form_edge_split",(ulong)uVar7,"tri side");
                        return uVar7;
                      }
                      local_80 = local_58;
                      local_78 = local_68->c2n[(long)local_68->size_per * (long)local_94 + 3];
                      local_7c = iVar1;
                      uVar7 = ref_cavity_insert_seg(ref_cavity,&local_80);
                      pRVar19 = local_68;
                      if (uVar7 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                               ,0x5cd,"ref_cavity_form_edge_split",(ulong)uVar7,"tri side");
                        return uVar7;
                      }
                    }
                    lVar11 = lVar11 + 1;
                  } while (lVar11 < pRVar19->edge_per);
                }
                iVar13 = iVar13 + 1;
              } while (iVar13 < pRVar19->node_per);
            }
            pRVar4 = pRVar19->ref_adj->item;
            iVar13 = pRVar4[(int)local_70].next;
            uVar14 = (ulong)iVar13;
            if (uVar14 == 0xffffffffffffffff) {
              local_94 = -1;
            }
            else {
              local_94 = pRVar4[uVar14].ref;
            }
            pRVar19 = local_68;
          } while (iVar13 != -1);
        }
      }
    }
    RVar9 = ref_cavity_verify_face_manifold(ref_cavity);
    if (RVar9 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x5d4,"ref_cavity_form_edge_split",1,"split face manifold");
      return 1;
    }
    RVar9 = ref_cavity_verify_seg_manifold(ref_cavity);
    if (RVar9 != 0) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
             0x5d5,"ref_cavity_form_edge_split",1,"split seg manifold");
      return 1;
    }
  }
  else {
LAB_001acd82:
    ref_cavity->state = REF_CAVITY_PARTITION_CONSTRAINED;
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_edge_split(REF_CAVITY ref_cavity,
                                              REF_GRID ref_grid, REF_INT node0,
                                              REF_INT node1, REF_INT new_node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_node, cell;
  REF_INT face_node, cell_face;
  REF_BOOL has_triangle, has_node0, has_node1;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3], seg_nodes[3];
  REF_INT cell_edge, n0, n1;

  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, new_node), "init form empty");
  if (!ref_node_owned(ref_node, node0) || !ref_node_owned(ref_node, node1) ||
      !ref_node_owned(ref_node, new_node)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cavity->split_node0 = node0;
  ref_cavity->split_node1 = node1;

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node0 = (node0 == face_nodes[0] || node0 == face_nodes[1] ||
                   node0 == face_nodes[2]);
      has_node1 = (node1 == face_nodes[0] || node1 == face_nodes[1] ||
                   node1 == face_nodes[2]);
      if (!(has_node0 && has_node1)) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_has_side(ref_cell, node0, node1, &has_triangle),
      "triangle side");
  if (has_triangle) {
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
      RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local),
          "local cell");
      if (!all_local) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
      each_ref_cell_cell_edge(ref_cell, cell_edge) {
        n0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
        n1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
        if (MIN(node0, node1) == MIN(n0, n1) &&
            MAX(node0, node1) == MAX(n0, n1)) {
          /* skip the edge to be split */
        } else {
          seg_nodes[0] = n0;
          seg_nodes[1] = n1;
          seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
          RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
        }
      }
    }
    RAS(1 == ref_list_n(ref_cavity_tri_list(ref_cavity)) ||
            2 == ref_list_n(ref_cavity_tri_list(ref_cavity)),
        "expect one or two tri");
    if (1 == ref_list_n(ref_cavity_tri_list(ref_cavity))) {
      each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node,
                                 cell) {
        each_ref_cell_cell_edge(ref_cell, cell_edge) {
          n0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
          n1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);
          if (MIN(node0, node1) == MIN(n0, n1) &&
              MAX(node0, node1) == MAX(n0, n1)) {
            /* close topo with explicit edge split */
            seg_nodes[0] = n0;
            seg_nodes[1] = new_node;
            seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
            RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
            seg_nodes[0] = new_node;
            seg_nodes[1] = n1;
            seg_nodes[2] = ref_cell_c2n(ref_cell, 3, cell);
            RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
          }
        }
      }
    }
  }

  RSS(ref_cavity_verify_face_manifold(ref_cavity), "split face manifold");
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "split seg manifold");

  return REF_SUCCESS;
}